

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noise_model.c
# Opt level: O1

void aom_flat_block_finder_extract_block
               (aom_flat_block_finder_t *block_finder,uint8_t *data,int w,int h,int stride,int offsx
               ,int offsy,double *plane,double *block)

{
  uint uVar1;
  double *pdVar2;
  int row;
  double *pdVar3;
  double *pdVar4;
  ulong uVar5;
  uint uVar6;
  int iVar7;
  long lVar8;
  double *pdVar9;
  ulong uVar10;
  double *pdVar11;
  long lVar12;
  ulong uVar13;
  int iVar14;
  double dVar15;
  double local_68 [4];
  double local_48 [2];
  double AtA_inv_b [3];
  double plane_coords [3];
  
  uVar1 = block_finder->block_size;
  uVar5 = (ulong)uVar1;
  uVar6 = uVar1 * uVar1;
  pdVar9 = block_finder->AtA_inv;
  pdVar2 = block_finder->A;
  if (block_finder->use_highbd == 0) {
    if (0 < (int)uVar1) {
      uVar13 = 0;
      pdVar3 = block;
      do {
        iVar14 = (int)((long)offsy + uVar13);
        iVar7 = h + -1;
        if (iVar14 < h + -1) {
          iVar7 = iVar14;
        }
        if ((long)((long)offsy + uVar13) < 0) {
          iVar7 = 0;
        }
        uVar10 = 0;
        do {
          iVar14 = offsx + (int)uVar10;
          if (w + -1 <= iVar14) {
            iVar14 = w + -1;
          }
          if ((long)((long)offsx + uVar10) < 0) {
            iVar14 = 0;
          }
          pdVar3[uVar10] = (double)data[iVar14 + iVar7 * stride] / block_finder->normalization;
          uVar10 = uVar10 + 1;
        } while (uVar5 != uVar10);
        uVar13 = uVar13 + 1;
        pdVar3 = pdVar3 + uVar5;
      } while (uVar13 != uVar5);
    }
  }
  else if (0 < (int)uVar1) {
    uVar13 = 0;
    pdVar3 = block;
    do {
      iVar14 = (int)(uVar13 + (long)offsy);
      iVar7 = h + -1;
      if (iVar14 < h + -1) {
        iVar7 = iVar14;
      }
      if ((long)(uVar13 + (long)offsy) < 0) {
        iVar7 = 0;
      }
      uVar10 = 0;
      do {
        iVar14 = (int)uVar10 + offsx;
        if (w + -1 <= iVar14) {
          iVar14 = w + -1;
        }
        if ((long)((long)offsx + uVar10) < 0) {
          iVar14 = 0;
        }
        pdVar3[uVar10] =
             (double)*(ushort *)(data + (long)(iVar14 + iVar7 * stride) * 2) /
             block_finder->normalization;
        uVar10 = uVar10 + 1;
      } while (uVar5 != uVar10);
      uVar13 = uVar13 + 1;
      pdVar3 = pdVar3 + uVar5;
    } while (uVar13 != uVar5);
  }
  pdVar3 = local_68;
  lVar8 = 0;
  pdVar4 = pdVar2;
  do {
    dVar15 = 0.0;
    if (uVar5 != 0) {
      uVar13 = 0;
      pdVar11 = pdVar4;
      do {
        dVar15 = dVar15 + block[uVar13] * *pdVar11;
        uVar13 = uVar13 + 1;
        pdVar11 = pdVar11 + 3;
      } while (uVar6 != uVar13);
    }
    *pdVar3 = dVar15;
    pdVar3 = pdVar3 + 1;
    lVar8 = lVar8 + 1;
    pdVar4 = pdVar4 + 1;
  } while (lVar8 != 3);
  lVar8 = 0;
  pdVar3 = local_48;
  do {
    dVar15 = 0.0;
    lVar12 = 0;
    do {
      dVar15 = dVar15 + pdVar9[lVar12] * local_68[lVar12];
      lVar12 = lVar12 + 1;
    } while (lVar12 != 3);
    *pdVar3 = dVar15;
    lVar8 = lVar8 + 1;
    pdVar9 = pdVar9 + 3;
    pdVar3 = pdVar3 + 1;
  } while (lVar8 != 3);
  if (uVar5 != 0) {
    uVar13 = 0;
    uVar10 = 0;
    pdVar9 = plane;
    do {
      dVar15 = 0.0;
      lVar8 = 0;
      do {
        dVar15 = dVar15 + pdVar2[uVar13 + lVar8] * local_48[lVar8];
        lVar8 = lVar8 + 1;
      } while (lVar8 != 3);
      *pdVar9 = dVar15;
      uVar10 = uVar10 + 1;
      uVar13 = (ulong)((int)uVar13 + 3);
      pdVar9 = pdVar9 + 1;
    } while (uVar10 != uVar6);
  }
  if (uVar5 != 0) {
    uVar5 = 0;
    do {
      block[uVar5] = block[uVar5] - plane[uVar5];
      uVar5 = uVar5 + 1;
    } while (uVar6 + (uVar6 == 0) != uVar5);
  }
  return;
}

Assistant:

void aom_flat_block_finder_extract_block(
    const aom_flat_block_finder_t *block_finder, const uint8_t *const data,
    int w, int h, int stride, int offsx, int offsy, double *plane,
    double *block) {
  const int block_size = block_finder->block_size;
  const int n = block_size * block_size;
  const double *A = block_finder->A;
  const double *AtA_inv = block_finder->AtA_inv;
  double plane_coords[kLowPolyNumParams];
  double AtA_inv_b[kLowPolyNumParams];
  int xi, yi, i;

  if (block_finder->use_highbd) {
    const uint16_t *const data16 = (const uint16_t *const)data;
    for (yi = 0; yi < block_size; ++yi) {
      const int y = clamp(offsy + yi, 0, h - 1);
      for (xi = 0; xi < block_size; ++xi) {
        const int x = clamp(offsx + xi, 0, w - 1);
        block[yi * block_size + xi] =
            ((double)data16[y * stride + x]) / block_finder->normalization;
      }
    }
  } else {
    for (yi = 0; yi < block_size; ++yi) {
      const int y = clamp(offsy + yi, 0, h - 1);
      for (xi = 0; xi < block_size; ++xi) {
        const int x = clamp(offsx + xi, 0, w - 1);
        block[yi * block_size + xi] =
            ((double)data[y * stride + x]) / block_finder->normalization;
      }
    }
  }
  multiply_mat(block, A, AtA_inv_b, 1, n, kLowPolyNumParams);
  multiply_mat(AtA_inv, AtA_inv_b, plane_coords, kLowPolyNumParams,
               kLowPolyNumParams, 1);
  multiply_mat(A, plane_coords, plane, n, kLowPolyNumParams, 1);

  for (i = 0; i < n; ++i) {
    block[i] -= plane[i];
  }
}